

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

VectorizedFunc<vkt::shaderexecutor::Functions::Cos,_2> *
vkt::shaderexecutor::
instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,2>>(void)

{
  int iVar1;
  
  if (instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,2>>()::
      s_instance == '\0') {
    iVar1 = __cxa_guard_acquire(&instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,2>>()
                                 ::s_instance);
    if (iVar1 != 0) {
      instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,_2>_>::
      s_instance.
      super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
      .m_func = (Func<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)instance<vkt::shaderexecutor::Functions::Cos>();
      instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,_2>_>::
      s_instance.
      super_GenFunc<vkt::shaderexecutor::Signature<float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_2>
      .
      super_PrimitiveFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      .
      super_Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      .super_FuncBase._vptr_FuncBase =
           (Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            )&PTR__FuncBase_00d78820;
      __cxa_guard_release(&instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,2>>()
                           ::s_instance);
    }
  }
  return &instance<vkt::shaderexecutor::VectorizedFunc<vkt::shaderexecutor::Functions::Cos,_2>_>::
          s_instance;
}

Assistant:

const T& instance (void)
{
	static const T s_instance = T();
	return s_instance;
}